

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&)>
::_call<0,1>(cni_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&),cs_impl::any(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  void *in_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  any local_28;
  
  local_28.mDat = (proxy *)in_RAX;
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             try_convert_and_check<const_std::shared_ptr<cs::context_type>_&,_const_std::shared_ptr<cs::context_type>_&,_std::shared_ptr<cs::context_type>,_0UL>
             ::convert(*(var **)param_2);
  try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  ::convert((var *)(*(long *)param_2 + 8));
  std::
  function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<cs_impl::any_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_28,(shared_ptr<cs::context_type> *)args,__args_1);
  *(proxy **)this = local_28.mDat;
  local_28.mDat = (proxy *)0x0;
  any::recycle(&local_28);
  return (any)(proxy *)this;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}